

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

size_t __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::eraseRange<0ul,char_const(&)[4],char_const(&)[4]>
          (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
           *this,char (*begin) [4],char (*end) [4])

{
  size_t sVar1;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table_00;
  Iterator local_88;
  Iterator local_70;
  IterRange<kj::_::BTreeImpl::Iterator> local_58;
  
  table.size_ = *(long *)(this + 8) - (long)*(StringPtr **)this >> 5;
  table.ptr = *(StringPtr **)this;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  seek<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4]>
            (&local_70,(TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)(this + 0x20),table,
             begin);
  table_00.size_ = *(long *)(this + 8) - (long)*(StringPtr **)this >> 5;
  table_00.ptr = *(StringPtr **)this;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  seek<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4]>
            (&local_88,(TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)(this + 0x20),table_00,
             end);
  local_58.e.row = local_88.row;
  local_58.e._20_4_ = local_88._20_4_;
  local_58.e.tree = local_88.tree;
  local_58.e.leaf = local_88.leaf;
  local_58.b.tree = local_70.tree;
  local_58.b.leaf = local_70.leaf;
  local_58.b.row = local_70.row;
  local_58.b._20_4_ = local_70._20_4_;
  sVar1 = eraseAllImpl<kj::_::IterRange<kj::_::BTreeImpl::Iterator>&>(this,&local_58);
  return sVar1;
}

Assistant:

size_t Table<Row, Indexes...>::eraseRange(BeginKey&& begin, EndKey&& end) {
  auto inner = _::iterRange(get<index>(indexes).seek(rows.asPtr(), kj::fwd<BeginKey>(begin)),
                            get<index>(indexes).seek(rows.asPtr(), kj::fwd<EndKey>(end)));
  return eraseAllImpl(inner);
}